

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O3

VisitReturn __thiscall QMakeEvaluator::testFunc_cache(QMakeEvaluator *this,ProStringList *args)

{
  QMakeGlobals *pQVar1;
  Data<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_> *this_00;
  QMakeEvaluator *this_01;
  undefined1 *puVar2;
  byte bVar3;
  byte bVar4;
  _Base_ptr p_Var5;
  Data *pDVar6;
  qsizetype qVar7;
  Data *pDVar8;
  iterator iVar9;
  Data *pDVar10;
  undefined8 uVar11;
  Data *pDVar12;
  bool bVar13;
  compare_eq_result_container<QList<ProString>,_ProString> cVar14;
  bool bVar15;
  CutResult CVar16;
  VisitReturn VVar17;
  ProValueMap *pPVar18;
  Node<QMakeBaseKey,_QMakeBaseEnv_*> *pNVar19;
  QArrayDataPointer<ProString> *this_02;
  QList<ProString> *pQVar20;
  QChar QVar21;
  char16_t *pcVar22;
  int iVar23;
  QArrayData *pQVar24;
  QString *pQVar25;
  long lVar26;
  char *pcVar27;
  ProString *pPVar28;
  QMakeBaseEnv *pQVar29;
  long in_FS_OFFSET;
  QByteArrayView QVar30;
  QAnyStringView QVar31;
  QByteArrayView QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QAnyStringView QVar37;
  QStringView vals;
  QLatin1String other;
  QLatin1String other_00;
  QLatin1String other_01;
  QLatin1String other_02;
  QLatin1String other_03;
  QLatin1String other_04;
  QLatin1String other_05;
  QLatin1String other_06;
  ProKey dstvar;
  ProKey srcvar;
  int local_1bc;
  ProString local_168;
  QArrayDataPointer<QString> local_138;
  QArrayDataPointer<ProString> local_118;
  iterator local_100;
  undefined1 local_f8 [28];
  int iStack_dc;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  QString local_c8;
  undefined1 local_a8 [28];
  int iStack_8c;
  undefined1 *local_88;
  undefined1 *puStack_80;
  QMakeBaseKey local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff70 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ProString::ProString((ProString *)local_a8);
  if ((ulong)(args->super_QList<ProString>).d.size < 2) {
    bVar4 = 1;
    iVar23 = 1;
    local_1bc = 0;
  }
  else {
    local_78.root.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.root.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.root.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pPVar28 = (args->super_QList<ProString>).d.ptr;
    pcVar22 = pPVar28[1].m_string.d.ptr;
    local_f8._0_8_ = SEXT48(pPVar28[1].m_offset);
    local_168.m_string.d.d = (Data *)(long)pPVar28[1].m_length;
    CVar16 = QtPrivate::QContainerImplHelper::mid
                       (pPVar28[1].m_string.d.size,(qsizetype *)local_f8,(qsizetype *)&local_168);
    pQVar24 = (QArrayData *)0x0;
    if (CVar16 == Null) {
      pcVar22 = (char16_t *)0x0;
    }
    else {
      pcVar22 = pcVar22 + local_f8._0_8_;
      pQVar24 = &(local_168.m_string.d.d)->super_QArrayData;
    }
    vals.m_data = pcVar22;
    vals.m_size = (qsizetype)pQVar24;
    split_value_list((ProStringList *)&local_78,this,vals,0);
    if ((undefined1 *)local_78.root.d.size == (undefined1 *)0x0) {
      local_1bc = 0;
      iVar23 = 1;
      bVar4 = 1;
      if (2 < (ulong)(args->super_QList<ProString>).d.size) goto LAB_0026ee96;
    }
    else {
      lVar26 = local_78.root.d.size * 0x30;
      local_1bc = 0;
      iVar23 = 1;
      bVar4 = 1;
      pPVar28 = (ProString *)local_78.root.d.ptr;
      do {
        other.m_data = "transient";
        other.m_size = 9;
        bVar13 = ProString::operator==(pPVar28,other);
        if (bVar13) {
          bVar4 = 0;
        }
        else {
          other_00.m_data = "super";
          other_00.m_size = 5;
          bVar13 = ProString::operator==(pPVar28,other_00);
          if (bVar13) {
            iVar23 = 2;
          }
          else {
            other_01.m_data = "stash";
            other_01.m_size = 5;
            bVar13 = ProString::operator==(pPVar28,other_01);
            if (bVar13) {
              iVar23 = 0;
            }
            else {
              other_02.m_data = "set";
              other_02.m_size = 3;
              bVar13 = ProString::operator==(pPVar28,other_02);
              if (bVar13) {
                local_1bc = 0;
              }
              else {
                other_03.m_data = "add";
                other_03.m_size = 3;
                bVar13 = ProString::operator==(pPVar28,other_03);
                local_1bc = 1;
                if (!bVar13) {
                  other_04.m_data = "sub";
                  other_04.m_size = 3;
                  bVar13 = ProString::operator==(pPVar28,other_04);
                  local_1bc = 2;
                  if (!bVar13) {
                    QVar36.m_data = (storage_type *)0x19;
                    QVar36.m_size = (qsizetype)&local_168;
                    QString::fromLatin1(QVar36);
                    pcVar22 = (pPVar28->m_string).d.ptr;
                    local_f8._0_8_ = SEXT48(pPVar28->m_offset);
                    local_c8.d.d = (Data *)(long)pPVar28->m_length;
                    CVar16 = QtPrivate::QContainerImplHelper::mid
                                       ((pPVar28->m_string).d.size,(qsizetype *)local_f8,
                                        (qsizetype *)&local_c8);
                    QVar21.ucs = (char16_t)local_c8.d.d;
                    iVar23 = (int)pcVar22 + (int)local_f8._0_8_ * 2;
                    if (CVar16 == Null) {
                      QVar21.ucs = L'\0';
                      iVar23 = 0;
                    }
                    QVar37.m_size = (size_t)&local_168;
                    QVar37.field_0.m_data = local_f8;
                    QString::arg_impl(QVar37,iVar23,QVar21);
                    message(this,0x310,(QString *)local_f8);
                    if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
                      }
                    }
                    if (&(local_168.m_string.d.d)->super_QArrayData == (QArrayData *)0x0)
                    goto LAB_0026f538;
                    LOCK();
                    ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    iVar23 = ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i;
                    UNLOCK();
                    pQVar24 = &(local_168.m_string.d.d)->super_QArrayData;
                    goto joined_r0x0026fe98;
                  }
                }
              }
            }
          }
        }
        pPVar28 = pPVar28 + 1;
        lVar26 = lVar26 + -0x30;
      } while (lVar26 != 0);
      if ((ulong)(args->super_QList<ProString>).d.size < 3) {
        if (local_1bc != 0) {
          QVar32.m_data = (storage_type *)0x3a;
          QVar32.m_size = (qsizetype)local_f8;
          QString::fromLatin1(QVar32);
          message(this,0x310,(QString *)local_f8);
          if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            iVar23 = (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i;
            UNLOCK();
            pQVar24 = (QArrayData *)local_f8._0_8_;
joined_r0x0026fe98:
            if (iVar23 == 0) {
              QArrayData::deallocate(pQVar24,2,0x10);
            }
          }
LAB_0026f538:
          QArrayDataPointer<ProString>::~QArrayDataPointer
                    ((QArrayDataPointer<ProString> *)&local_78);
          VVar17 = ReturnFalse;
          goto LAB_0026fb22;
        }
        local_1bc = 0;
      }
      else {
LAB_0026ee96:
        pPVar28 = (args->super_QList<ProString>).d.ptr;
        QString::operator=((QString *)local_a8,(QString *)(pPVar28 + 2));
        unique0x10000d82 = *(undefined1 **)&pPVar28[2].m_offset;
        local_88 = *(undefined1 **)&pPVar28[2].m_file;
        puStack_80 = (undefined1 *)pPVar28[2].m_hash;
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_78);
  }
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char16_t *)0x0;
  local_c8.d.size = 0;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff20 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ProString::ProString((ProString *)local_f8,(args->super_QList<ProString>).d.ptr);
  if (iStack_dc == 0) {
LAB_0026f69f:
    local_118.d = (Data *)0x0;
    local_118.ptr = (ProString *)0x0;
    local_118.size = 0;
    if (iVar23 == 1) {
      pQVar25 = &this->m_cachefile;
      if ((this->m_cachefile).d.size == 0) {
        local_138.d = (Data *)&this->m_outputDir;
        local_138.ptr = (QString *)0xd;
        local_138.size = 0x2b6915;
        QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                  (&local_168.m_string,(QStringBuilder<QString_&,_QLatin1String> *)&local_138);
        QDir::cleanPath((QString *)&local_78);
        pQVar24 = &((this->m_cachefile).d.d)->super_QArrayData;
        pPVar28 = (ProString *)(this->m_cachefile).d.ptr;
        (this->m_cachefile).d.d = local_78.root.d.d;
        (this->m_cachefile).d.ptr = local_78.root.d.ptr;
        puVar2 = (undefined1 *)(this->m_cachefile).d.size;
        (this->m_cachefile).d.size = local_78.root.d.size;
        local_78.root.d.d = (Data *)pQVar24;
        local_78.root.d.ptr = (char16_t *)pPVar28;
        local_78.root.d.size = (qsizetype)puVar2;
        if (pQVar24 != (QArrayData *)0x0) {
          LOCK();
          (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar24,2,0x10);
          }
        }
        if (&(local_168.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_168.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QDir::toNativeSeparators((QString *)&local_168);
        QString::toLocal8Bit_helper((QChar *)&local_78,(longlong)local_168.m_string.d.ptr);
        pPVar28 = (ProString *)local_78.root.d.ptr;
        if ((ProString *)local_78.root.d.ptr == (ProString *)0x0) {
          pPVar28 = (ProString *)&QByteArray::_empty;
        }
        printf("Info: creating cache file %s\n",pPVar28);
        if (&(local_78.root.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_78.root.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_168.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_168.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pcVar27 = "_QMAKE_CACHE_";
LAB_0026f9a3:
        ProKey::ProKey((ProKey *)&local_78,pcVar27);
        pQVar20 = &valuesRef(this,(ProKey *)&local_78)->super_QList<ProString>;
        ProString::ProString(&local_168,pQVar25);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)pQVar20,(pQVar20->d).size,&local_168);
        QList<ProString>::end(pQVar20);
        if (&(local_168.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_168.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_78.root.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_78.root.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
LAB_0026fa32:
      QString::operator=((QString *)&local_118,(QString *)pQVar25);
    }
    else {
      if (iVar23 == 2) {
        pQVar25 = &this->m_superfile;
        if ((this->m_superfile).d.size == 0) {
          local_138.d = (Data *)&this->m_outputDir;
          local_138.ptr = (QString *)0xd;
          local_138.size = 0x2b68e3;
          QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                    (&local_168.m_string,(QStringBuilder<QString_&,_QLatin1String> *)&local_138);
          QDir::cleanPath((QString *)&local_78);
          pQVar24 = &((this->m_superfile).d.d)->super_QArrayData;
          pPVar28 = (ProString *)(this->m_superfile).d.ptr;
          (this->m_superfile).d.d = local_78.root.d.d;
          (this->m_superfile).d.ptr = local_78.root.d.ptr;
          puVar2 = (undefined1 *)(this->m_superfile).d.size;
          (this->m_superfile).d.size = local_78.root.d.size;
          local_78.root.d.d = (Data *)pQVar24;
          local_78.root.d.ptr = (char16_t *)pPVar28;
          local_78.root.d.size = (qsizetype)puVar2;
          if (pQVar24 != (QArrayData *)0x0) {
            LOCK();
            (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar24->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar24,2,0x10);
            }
          }
          if (&(local_168.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_168.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          QDir::toNativeSeparators((QString *)&local_168);
          QString::toLocal8Bit_helper((QChar *)&local_78,(longlong)local_168.m_string.d.ptr);
          pPVar28 = (ProString *)local_78.root.d.ptr;
          if ((ProString *)local_78.root.d.ptr == (ProString *)0x0) {
            pPVar28 = (ProString *)&QByteArray::_empty;
          }
          printf("Info: creating super cache file %s\n",pPVar28);
          if (&(local_78.root.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if (((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_78.root.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_168.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_168.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          pcVar27 = "_QMAKE_SUPER_CACHE_";
          goto LAB_0026f9a3;
        }
        goto LAB_0026fa32;
      }
      QString::operator=((QString *)&local_118,(QString *)&this->m_stashfile);
      if ((undefined1 *)local_118.size == (undefined1 *)0x0) {
        local_138.d = (Data *)&this->m_outputDir;
        local_138.ptr = (QString *)0xd;
        local_138.size = 0x2b694f;
        QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                  (&local_168.m_string,(QStringBuilder<QString_&,_QLatin1String> *)&local_138);
        QDir::cleanPath((QString *)&local_78);
        qVar7 = local_78.root.d.size;
        pDVar10 = local_78.root.d.d;
        pPVar28 = local_118.ptr;
        pDVar8 = local_118.d;
        local_78.root.d.d = (Data *)local_118.d;
        local_118.d = (Data *)pDVar10;
        local_118.ptr = (ProString *)local_78.root.d.ptr;
        local_78.root.d.ptr = (char16_t *)pPVar28;
        local_78.root.d.size = local_118.size;
        local_118.size = qVar7;
        if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
          }
        }
        if (&(local_168.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_168.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      bVar13 = QMakeVfs::exists(this->m_vfs,(QString *)&local_118,(VfsFlags)0x0);
      if (!bVar13) {
        QDir::toNativeSeparators((QString *)&local_168);
        QString::toLocal8Bit_helper((QChar *)&local_78,(longlong)local_168.m_string.d.ptr);
        pPVar28 = (ProString *)local_78.root.d.ptr;
        if ((ProString *)local_78.root.d.ptr == (ProString *)0x0) {
          pPVar28 = (ProString *)&QByteArray::_empty;
        }
        printf("Info: creating stash file %s\n",pPVar28);
        if (&(local_78.root.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_78.root.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_168.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_168.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        ProKey::ProKey((ProKey *)&local_78,"_QMAKE_STASH_");
        pQVar20 = &valuesRef(this,(ProKey *)&local_78)->super_QList<ProString>;
        ProString::ProString(&local_168,(QString *)&local_118);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)pQVar20,(pQVar20->d).size,&local_168);
        QList<ProString>::end(pQVar20);
        if (&(local_168.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_168.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_78.root.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_78.root.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    QVar35.m_data = (storage_type *)0x6;
    QVar35.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar35);
    VVar17 = writeFile(this,&local_78.root,(QString *)&local_118,(OpenMode)0x4,(VfsFlags)0x0,
                       &local_c8);
    if (&(local_78.root.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_78.root.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_118.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if (iStack_8c == 0) {
      QString::operator=((QString *)local_a8,(QString *)local_f8);
      stack0xffffffffffffff70 = stack0xffffffffffffff20;
      local_88 = local_d8;
      puStack_80 = puStack_d0;
    }
    local_100._M_node = (_Base_ptr)0x0;
    pPVar18 = findValues(this,(ProKey *)local_a8,(Iterator *)&local_100);
    iVar9._M_node = local_100._M_node;
    if (pPVar18 == (ProValueMap *)0x0) {
      QVar30.m_data = (storage_type *)0x1b;
      QVar30.m_size = (qsizetype)&local_168;
      QString::fromLatin1(QVar30);
      uVar11 = local_a8._8_8_;
      local_78.root.d.d = (Data *)(long)(int)local_a8._24_4_;
      local_118.d = (Data *)(long)iStack_8c;
      CVar16 = QtPrivate::QContainerImplHelper::mid
                         (local_a8._16_8_,(qsizetype *)&local_78,(qsizetype *)&local_118);
      QVar21.ucs = (char16_t)local_118.d;
      iVar23 = (int)uVar11 + (int)local_78.root.d.d * 2;
      if (CVar16 == Null) {
        QVar21.ucs = L'\0';
        iVar23 = 0;
      }
      QVar31.m_size = (size_t)&local_168;
      QVar31.field_0.m_data = &local_78;
      QString::arg_impl(QVar31,iVar23,QVar21);
      message(this,0x310,&local_78.root);
      if (&(local_78.root.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_78.root.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_168.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_168.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_168.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      VVar17 = ReturnFalse;
    }
    else {
      p_Var5 = local_100._M_node + 2;
      local_168.m_string.d.d = (Data *)0x0;
      local_168.m_string.d.ptr = (char16_t *)0x0;
      local_168.m_string.d.size = 0;
      bVar3 = 0;
      bVar13 = false;
      do {
        pQVar1 = this->m_option;
        QMakeBaseKey::QMakeBaseKey(&local_78,&this->m_buildRoot,&this->m_stashfile,bVar13);
        this_00 = (pQVar1->baseEnvs).d;
        if ((this_00 == (Data<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_> *)0x0) ||
           (pNVar19 = QHashPrivate::Data<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_>::
                      findNode<QMakeBaseKey>(this_00,&local_78),
           pNVar19 == (Node<QMakeBaseKey,_QMakeBaseEnv_*> *)0x0)) {
          pQVar29 = (QMakeBaseEnv *)0x0;
        }
        else {
          pQVar29 = pNVar19->value;
        }
        if (&(local_78.stash.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.stash.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.stash.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_78.stash.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_78.stash.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_78.root.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_78.root.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (pQVar29 != (QMakeBaseEnv *)0x0) {
          this_01 = pQVar29->evaluator;
          values((ProStringList *)&local_118,this_01,(ProKey *)local_f8);
          if (local_1bc == 0) {
            QArrayDataPointer<ProString>::operator=
                      ((QArrayDataPointer<ProString> *)&local_168,
                       (QArrayDataPointer<ProString> *)&p_Var5->_M_left);
          }
          else {
            QArrayDataPointer<ProString>::operator=
                      ((QArrayDataPointer<ProString> *)&local_168,&local_118);
            if (local_1bc == 1) {
              QtPrivate::QCommonArrayOps<ProString>::growAppend
                        ((QCommonArrayOps<ProString> *)&local_168,
                         (ProString *)iVar9._M_node[2]._M_right,
                         (ProString *)iVar9._M_node[2]._M_right + *(long *)(iVar9._M_node + 3));
            }
            else {
              ProStringList::removeEach
                        ((ProStringList *)&local_168,(ProStringList *)&p_Var5->_M_left);
            }
          }
          cVar14 = QList<ProString>::operator==
                             ((QList<ProString> *)&local_118,(QList<ProString> *)&local_168);
          if (!cVar14) {
            if ((iVar23 != 0) || ((this->m_stashfile).d.size != 0)) {
              this_02 = (QArrayDataPointer<ProString> *)valuesRef(this_01,(ProKey *)local_f8);
              QArrayDataPointer<ProString>::operator=
                        (this_02,(QArrayDataPointer<ProString> *)&local_168);
              bVar3 = 1;
              if (iVar23 == 2) {
                other_05.m_data = "QMAKEPATH";
                other_05.m_size = 9;
                bVar15 = ProString::operator==((ProString *)local_f8,other_05);
                if (bVar15) {
                  ProStringList::toQStringList
                            ((QStringList *)&local_138,(ProStringList *)&local_168);
                  qVar7 = local_138.size;
                  pQVar25 = local_138.ptr;
                  pDVar6 = local_138.d;
                  local_138.size = 0;
                  local_138.d = (Data *)0x0;
                  local_138.ptr = (QString *)0x0;
                  local_78.root.d.d = (Data *)(this_01->m_qmakepath).d.d;
                  local_78.root.d.ptr = (char16_t *)(this_01->m_qmakepath).d.ptr;
                  (this_01->m_qmakepath).d.d = pDVar6;
                  (this_01->m_qmakepath).d.ptr = pQVar25;
                  local_78.root.d.size = (this_01->m_qmakepath).d.size;
                  (this_01->m_qmakepath).d.size = qVar7;
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)&local_78);
                  QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
                  updateMkspecPaths(this_01);
                }
                else {
                  other_06.m_data = "QMAKEFEATURES";
                  other_06.m_size = 0xd;
                  bVar15 = ProString::operator==((ProString *)local_f8,other_06);
                  if (!bVar15) goto LAB_0026f315;
                  ProStringList::toQStringList
                            ((QStringList *)&local_138,(ProStringList *)&local_168);
                  qVar7 = local_138.size;
                  pQVar25 = local_138.ptr;
                  pDVar6 = local_138.d;
                  local_138.size = 0;
                  local_138.d = (Data *)0x0;
                  local_138.ptr = (QString *)0x0;
                  local_78.root.d.d = (Data *)(this_01->m_qmakefeatures).d.d;
                  local_78.root.d.ptr = (char16_t *)(this_01->m_qmakefeatures).d.ptr;
                  (this_01->m_qmakefeatures).d.d = pDVar6;
                  (this_01->m_qmakefeatures).d.ptr = pQVar25;
                  local_78.root.d.size = (this_01->m_qmakefeatures).d.size;
                  (this_01->m_qmakefeatures).d.size = qVar7;
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)&local_78);
                  QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
                }
                updateFeaturePaths(this_01);
                if (this->m_hostBuild == bVar13) {
                  QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset
                            (&this->m_featureRoots,(this_01->m_featureRoots).d.ptr);
                }
                goto LAB_0026f315;
              }
            }
            bVar3 = 1;
          }
LAB_0026f315:
          QArrayDataPointer<ProString>::~QArrayDataPointer(&local_118);
        }
        bVar15 = bVar13 == false;
        bVar13 = true;
      } while (bVar15);
      if ((bool)(bVar4 & bVar3)) {
        ProString::toQString(&local_78.root,(ProString *)local_f8);
        qVar7 = local_78.root.d.size;
        pDVar12 = local_78.root.d.d;
        pcVar22 = local_c8.d.ptr;
        pDVar10 = local_c8.d.d;
        local_78.root.d.d = local_c8.d.d;
        local_c8.d.d = pDVar12;
        local_c8.d.ptr = local_78.root.d.ptr;
        local_78.root.d.ptr = pcVar22;
        local_78.root.d.size = local_c8.d.size;
        local_c8.d.size = qVar7;
        if (&pDVar10->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
          }
        }
        if ((local_1bc == 1) || (local_1bc == 2)) {
          pcVar27 = (char *)0x3;
        }
        else {
          pcVar27 = (char *)0x2;
        }
        QVar33.m_size = &local_c8;
        QVar33.m_data = pcVar27;
        QString::append(QVar33);
        lVar26 = *(long *)(iVar9._M_node + 3);
        if (lVar26 != 0) {
          if (lVar26 == 1) {
            QString::append((QChar)(char16_t)&local_c8);
            quoteValue(&local_78.root,(ProString *)iVar9._M_node[2]._M_right);
            QString::append((QString *)&local_c8);
            if (&(local_78.root.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if (((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate(&(local_78.root.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          else {
            pPVar28 = (ProString *)iVar9._M_node[2]._M_right;
            lVar26 = lVar26 * 0x30;
            do {
              QVar34.m_data = (char *)0x7;
              QVar34.m_size = (qsizetype)&local_c8;
              QString::append(QVar34);
              quoteValue(&local_78.root,pPVar28);
              QString::append((QString *)&local_c8);
              if (&(local_78.root.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_78.root.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_78.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_78.root.d.d)->super_QArrayData,2,0x10);
                }
              }
              pPVar28 = pPVar28 + 1;
              lVar26 = lVar26 + -0x30;
            } while (lVar26 != 0);
          }
        }
        QString::append((QChar)(char16_t)&local_c8);
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_168)
        ;
        goto LAB_0026f69f;
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_168);
      VVar17 = ReturnTrue;
    }
  }
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0026fb22:
  if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return VVar17;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::testFunc_cache(const ProStringList &args)
{
    bool persist = true;
    enum { TargetStash, TargetCache, TargetSuper } target = TargetCache;
    enum { CacheSet, CacheAdd, CacheSub } mode = CacheSet;
    ProKey srcvar;
    if (args.size() >= 2) {
        const auto opts = split_value_list(args.at(1).toQStringView());
        for (const ProString &opt : opts) {
            if (opt == QLatin1String("transient")) {
                persist = false;
            } else if (opt == QLatin1String("super")) {
                target = TargetSuper;
            } else if (opt == QLatin1String("stash")) {
                target = TargetStash;
            } else if (opt == QLatin1String("set")) {
                mode = CacheSet;
            } else if (opt == QLatin1String("add")) {
                mode = CacheAdd;
            } else if (opt == QLatin1String("sub")) {
                mode = CacheSub;
            } else {
                evalError(fL1S("cache(): invalid flag %1.").arg(opt.toQStringView()));
                return ReturnFalse;
            }
        }
        if (args.size() >= 3) {
            srcvar = args.at(2).toKey();
        } else if (mode != CacheSet) {
            evalError(fL1S("cache(): modes other than 'set' require a source variable."));
            return ReturnFalse;
        }
    }
    QString varstr;
    ProKey dstvar = args.at(0).toKey();
    if (!dstvar.isEmpty()) {
        if (srcvar.isEmpty())
            srcvar = dstvar;
        ProValueMap::Iterator srcvarIt;
        if (!findValues(srcvar, &srcvarIt)) {
            evalError(fL1S("Variable %1 is not defined.").arg(srcvar.toQStringView()));
            return ReturnFalse;
        }
        // The caches for the host and target may differ (e.g., when we are manipulating
        // CONFIG), so we cannot compute a common new value for both.
        const ProStringList &diffval = *srcvarIt;
        ProStringList newval;
        bool changed = false;
        for (bool hostBuild = false; ; hostBuild = true) {
#ifdef PROEVALUATOR_THREAD_SAFE
            m_option->mutex.lock();
#endif
            QMakeBaseEnv *baseEnv =
                m_option->baseEnvs.value(QMakeBaseKey(m_buildRoot, m_stashfile, hostBuild));
#ifdef PROEVALUATOR_THREAD_SAFE
            // It's ok to unlock this before locking baseEnv,
            // as we have no intention to initialize the env.
            m_option->mutex.unlock();
#endif
            do {
                if (!baseEnv)
                    break;
#ifdef PROEVALUATOR_THREAD_SAFE
                QMutexLocker locker(&baseEnv->mutex);
                if (baseEnv->inProgress && baseEnv->evaluator != this) {
                    // The env is still in the works, but it may be already past the cache
                    // loading. So we need to wait for completion and amend it as usual.
                    QThreadPool::globalInstance()->releaseThread();
                    baseEnv->cond.wait(&baseEnv->mutex);
                    QThreadPool::globalInstance()->reserveThread();
                }
                if (!baseEnv->isOk)
                    break;
#endif
                QMakeEvaluator *baseEval = baseEnv->evaluator;
                const ProStringList &oldval = baseEval->values(dstvar);
                if (mode == CacheSet) {
                    newval = diffval;
                } else {
                    newval = oldval;
                    if (mode == CacheAdd)
                        newval += diffval;
                    else
                        newval.removeEach(diffval);
                }
                if (oldval != newval) {
                    if (target != TargetStash || !m_stashfile.isEmpty()) {
                        baseEval->valuesRef(dstvar) = newval;
                        if (target == TargetSuper) {
                            do {
                                if (dstvar == QLatin1String("QMAKEPATH")) {
                                    baseEval->m_qmakepath = newval.toQStringList();
                                    baseEval->updateMkspecPaths();
                                } else if (dstvar == QLatin1String("QMAKEFEATURES")) {
                                    baseEval->m_qmakefeatures = newval.toQStringList();
                                } else {
                                    break;
                                }
                                baseEval->updateFeaturePaths();
                                if (hostBuild == m_hostBuild)
                                    m_featureRoots = baseEval->m_featureRoots;
                            } while (false);
                        }
                    }
                    changed = true;
                }
            } while (false);
            if (hostBuild)
                break;
        }
        // We assume that whatever got the cached value to be what it is now will do so
        // the next time as well, so we just skip the persisting if nothing changed.
        if (!persist || !changed)
            return ReturnTrue;
        varstr = dstvar.toQString();
        if (mode == CacheAdd)
            varstr += QLatin1String(" +=");
        else if (mode == CacheSub)
            varstr += QLatin1String(" -=");
        else
            varstr += QLatin1String(" =");
        if (diffval.size() == 1) {
            varstr += QLatin1Char(' ');
            varstr += quoteValue(diffval.at(0));
        } else if (!diffval.isEmpty()) {
            for (const ProString &vval : diffval) {
                varstr += QLatin1String(" \\\n    ");
                varstr += quoteValue(vval);
            }
        }
        varstr += QLatin1Char('\n');
    }
    QString fn;
    QMakeVfs::VfsFlags flags = (m_cumulative ? QMakeVfs::VfsCumulative : QMakeVfs::VfsExact);
    if (target == TargetSuper) {
        if (m_superfile.isEmpty()) {
            m_superfile = QDir::cleanPath(m_outputDir + QLatin1String("/.qmake.super"));
            printf("Info: creating super cache file %s\n", qPrintable(QDir::toNativeSeparators(m_superfile)));
            valuesRef(ProKey("_QMAKE_SUPER_CACHE_")) << ProString(m_superfile);
        }
        fn = m_superfile;
    } else if (target == TargetCache) {
        if (m_cachefile.isEmpty()) {
            m_cachefile = QDir::cleanPath(m_outputDir + QLatin1String("/.qmake.cache"));
            printf("Info: creating cache file %s\n", qPrintable(QDir::toNativeSeparators(m_cachefile)));
            valuesRef(ProKey("_QMAKE_CACHE_")) << ProString(m_cachefile);
            // We could update m_{source,build}Root and m_featureRoots here, or even
            // "re-home" our rootEnv, but this doesn't sound too useful - if somebody
            // wanted qmake to find something in the build directory, he could have
            // done so "from the outside".
            // The sub-projects will find the new cache all by themselves.
        }
        fn = m_cachefile;
    } else {
        fn = m_stashfile;
        if (fn.isEmpty())
            fn = QDir::cleanPath(m_outputDir + QLatin1String("/.qmake.stash"));
        if (!m_vfs->exists(fn, flags)) {
            printf("Info: creating stash file %s\n", qPrintable(QDir::toNativeSeparators(fn)));
            valuesRef(ProKey("_QMAKE_STASH_")) << ProString(fn);
        }
    }
    return writeFile(fL1S("cache "), fn, QIODevice::Append, flags, varstr);
}